

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall
Rml::Element::QuerySelectorAll(Element *this,ElementList *elements,String *selectors)

{
  pointer pcVar1;
  StyleSheetNodeListRaw leaf_nodes;
  String local_140;
  StyleSheetNode root_node;
  
  StyleSheetNode::StyleSheetNode(&root_node);
  StyleSheetParser::ConstructNodes(&leaf_nodes,&root_node,selectors);
  if (leaf_nodes.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      leaf_nodes.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (selectors->_M_dataplus)._M_p;
    GetAddress_abi_cxx11_(&local_140,this,false,true);
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",pcVar1,
                 local_140._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    QuerySelectorAllMatchRecursive(elements,&leaf_nodes,this,this);
  }
  ::std::_Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::~_Vector_base
            (&leaf_nodes.
              super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>);
  StyleSheetNode::~StyleSheetNode(&root_node);
  return;
}

Assistant:

void Element::QuerySelectorAll(ElementList& elements, const String& selectors)
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return;
	}

	QuerySelectorAllMatchRecursive(elements, leaf_nodes, this, this);
}